

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::ImmutableStringOneofFieldGenerator::GenerateBuilderMembers
          (ImmutableStringOneofFieldGenerator *this,Printer *printer)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  FieldDescriptor *pFVar1;
  bool bVar2;
  char *pcVar3;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view begin_varname;
  string_view begin_varname_00;
  string_view begin_varname_01;
  string_view begin_varname_02;
  string_view begin_varname_03;
  string_view begin_varname_04;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  size_t sStackY_230;
  LogMessageFatal local_220;
  Options local_210;
  Options local_1c0;
  Options local_170;
  Options local_120;
  Options local_d0;
  Options local_80;
  
  bVar2 = FieldDescriptor::has_presence((this->super_ImmutableStringFieldGenerator).descriptor_);
  if (bVar2) {
    pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
    Options::Options(&local_80,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,HAZZER,&local_80,false,false,false);
    Options::~Options(&local_80);
    vars = &(this->super_ImmutableStringFieldGenerator).variables_;
    text._M_str = 
    "@java.lang.Override\n$deprecation$public boolean ${$has$capitalized_name$$}$() {\n  return $has_oneof_case_message$;\n}\n"
    ;
    text._M_len = 0x75;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text);
    begin_varname._M_str = "{";
    begin_varname._M_len = 1;
    end_varname._M_str = "}";
    end_varname._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname,end_varname,
               (this->super_ImmutableStringFieldGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
    Options::Options(&local_d0,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,GETTER,&local_d0,false,false,false);
    Options::~Options(&local_d0);
    text_00._M_str =
         "@java.lang.Override\n$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (!(ref instanceof java.lang.String)) {\n    com.google.protobuf.ByteString bs =\n        (com.google.protobuf.ByteString) ref;\n    java.lang.String s = bs.toStringUtf8();\n    if ($has_oneof_case_message$) {\n"
    ;
    text_00._M_len = 0x191;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_00);
    begin_varname_00._M_str = "{";
    begin_varname_00._M_len = 1;
    end_varname_00._M_str = "}";
    end_varname_00._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_00,end_varname_00,
               (this->super_ImmutableStringFieldGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    bVar2 = CheckUtf8((this->super_ImmutableStringFieldGenerator).descriptor_);
    if (bVar2) {
      pcVar3 = "      $oneof_name$_ = s;\n";
      sStackY_230 = 0x19;
    }
    else {
      pcVar3 = "      if (bs.isValidUtf8()) {\n        $oneof_name$_ = s;\n      }\n";
      sStackY_230 = 0x41;
    }
    text_01._M_str = pcVar3;
    text_01._M_len = sStackY_230;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_01);
    text_02._M_str =
         "    }\n    return s;\n  } else {\n    return (java.lang.String) ref;\n  }\n}\n";
    text_02._M_len = 0x48;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_02);
    pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
    Options::Options(&local_120,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
    WriteFieldStringBytesAccessorDocComment(printer,pFVar1,GETTER,&local_120,false,false,false);
    Options::~Options(&local_120);
    text_03._M_str =
         "@java.lang.Override\n$deprecation$public com.google.protobuf.ByteString\n    ${$get$capitalized_name$Bytes$}$() {\n  java.lang.Object ref $default_init$;\n  if ($has_oneof_case_message$) {\n    ref = $oneof_name$_;\n  }\n  if (ref instanceof String) {\n    com.google.protobuf.ByteString b = \n        com.google.protobuf.ByteString.copyFromUtf8(\n            (java.lang.String) ref);\n    if ($has_oneof_case_message$) {\n      $oneof_name$_ = b;\n    }\n    return b;\n  } else {\n    return (com.google.protobuf.ByteString) ref;\n  }\n}\n"
    ;
    text_03._M_len = 0x20a;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_03);
    begin_varname_01._M_str = "{";
    begin_varname_01._M_len = 1;
    end_varname_01._M_str = "}";
    end_varname_01._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_01,end_varname_01,
               (this->super_ImmutableStringFieldGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0);
    pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
    Options::Options(&local_170,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,SETTER,&local_170,true,false,false);
    Options::~Options(&local_170);
    text_04._M_str =
         "$deprecation$public Builder ${$set$capitalized_name$$}$(\n    java.lang.String value) {\n  $null_check$\n  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
    ;
    text_04._M_len = 0xbb;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_04);
    begin_varname_02._M_str = "{";
    begin_varname_02._M_len = 1;
    end_varname_02._M_str = "}";
    end_varname_02._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_02,end_varname_02,
               (this->super_ImmutableStringFieldGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
    pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
    Options::Options(&local_1c0,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
    WriteFieldAccessorDocComment(printer,pFVar1,CLEARER,&local_1c0,true,false,false);
    Options::~Options(&local_1c0);
    text_05._M_str =
         "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n  if ($has_oneof_case_message$) {\n    $clear_oneof_case_message$;\n    $oneof_name$_ = null;\n    $on_changed$\n  }\n  return this;\n}\n"
    ;
    text_05._M_len = 0xc0;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_05);
    begin_varname_03._M_str = "{";
    begin_varname_03._M_len = 1;
    end_varname_03._M_str = "}";
    end_varname_03._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_03,end_varname_03,
               (this->super_ImmutableStringFieldGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
    pFVar1 = (this->super_ImmutableStringFieldGenerator).descriptor_;
    Options::Options(&local_210,&((this->super_ImmutableStringFieldGenerator).context_)->options_);
    WriteFieldStringBytesAccessorDocComment(printer,pFVar1,SETTER,&local_210,true,false,false);
    Options::~Options(&local_210);
    text_06._M_str =
         "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n    com.google.protobuf.ByteString value) {\n  $null_check$\n"
    ;
    text_06._M_len = 0x79;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_06);
    begin_varname_04._M_str = "{";
    begin_varname_04._M_len = 1;
    end_varname_04._M_str = "}";
    end_varname_04._M_len = 1;
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,begin_varname_04,end_varname_04,
               (this->super_ImmutableStringFieldGenerator).descriptor_,
               (optional<google::protobuf::io::AnnotationCollector::Semantic>)0x100000001);
    bVar2 = CheckUtf8((this->super_ImmutableStringFieldGenerator).descriptor_);
    if (bVar2) {
      text_07._M_str = "  checkByteStringIsUtf8(value);\n";
      text_07._M_len = 0x20;
      io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (printer,vars,text_07);
    }
    text_08._M_str =
         "  $set_oneof_case_message$;\n  $oneof_name$_ = value;\n  $on_changed$\n  return this;\n}\n"
    ;
    text_08._M_len = 0x55;
    io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (printer,vars,text_08);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_220,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/full/string_field.cc"
             ,0x21a,"descriptor_->has_presence()");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_220);
}

Assistant:

void ImmutableStringOneofFieldGenerator::GenerateBuilderMembers(
    io::Printer* printer) const {
  ABSL_DCHECK(descriptor_->has_presence());
  WriteFieldAccessorDocComment(printer, descriptor_, HAZZER,
                               context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public boolean ${$has$capitalized_name$$}$() {\n"
                 "  return $has_oneof_case_message$;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, GETTER,
                               context_->options());
  printer->Print(
      variables_,
      "@java.lang.Override\n"
      "$deprecation$public java.lang.String ${$get$capitalized_name$$}$() {\n"
      "  java.lang.Object ref $default_init$;\n"
      "  if ($has_oneof_case_message$) {\n"
      "    ref = $oneof_name$_;\n"
      "  }\n"
      "  if (!(ref instanceof java.lang.String)) {\n"
      "    com.google.protobuf.ByteString bs =\n"
      "        (com.google.protobuf.ByteString) ref;\n"
      "    java.lang.String s = bs.toStringUtf8();\n"
      "    if ($has_oneof_case_message$) {\n");
  printer->Annotate("{", "}", descriptor_);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "      $oneof_name$_ = s;\n");
  } else {
    printer->Print(variables_,
                   "      if (bs.isValidUtf8()) {\n"
                   "        $oneof_name$_ = s;\n"
                   "      }\n");
  }
  printer->Print(variables_,
                 "    }\n"
                 "    return s;\n"
                 "  } else {\n"
                 "    return (java.lang.String) ref;\n"
                 "  }\n"
                 "}\n");

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, GETTER,
                                          context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$public com.google.protobuf.ByteString\n"
                 "    ${$get$capitalized_name$Bytes$}$() {\n"
                 "  java.lang.Object ref $default_init$;\n"
                 "  if ($has_oneof_case_message$) {\n"
                 "    ref = $oneof_name$_;\n"
                 "  }\n"
                 "  if (ref instanceof String) {\n"
                 "    com.google.protobuf.ByteString b = \n"
                 "        com.google.protobuf.ByteString.copyFromUtf8(\n"
                 "            (java.lang.String) ref);\n"
                 "    if ($has_oneof_case_message$) {\n"
                 "      $oneof_name$_ = b;\n"
                 "    }\n"
                 "    return b;\n"
                 "  } else {\n"
                 "    return (com.google.protobuf.ByteString) ref;\n"
                 "  }\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  WriteFieldAccessorDocComment(printer, descriptor_, SETTER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(variables_,
                 "$deprecation$public Builder ${$set$capitalized_name$$}$(\n"
                 "    java.lang.String value) {\n"
                 "  $null_check$\n"
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  WriteFieldAccessorDocComment(printer, descriptor_, CLEARER,
                               context_->options(),
                               /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$clear$capitalized_name$$}$() {\n"
      "  if ($has_oneof_case_message$) {\n"
      "    $clear_oneof_case_message$;\n"
      "    $oneof_name$_ = null;\n"
      "    $on_changed$\n"
      "  }\n"
      "  return this;\n"
      "}\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);

  WriteFieldStringBytesAccessorDocComment(printer, descriptor_, SETTER,
                                          context_->options(),
                                          /* builder */ true);
  printer->Print(
      variables_,
      "$deprecation$public Builder ${$set$capitalized_name$Bytes$}$(\n"
      "    com.google.protobuf.ByteString value) {\n"
      "  $null_check$\n");
  printer->Annotate("{", "}", descriptor_, Semantic::kSet);
  if (CheckUtf8(descriptor_)) {
    printer->Print(variables_, "  checkByteStringIsUtf8(value);\n");
  }
  printer->Print(variables_,
                 "  $set_oneof_case_message$;\n"
                 "  $oneof_name$_ = value;\n"
                 "  $on_changed$\n"
                 "  return this;\n"
                 "}\n");
}